

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::FeatureSetDefaults::_InternalSerialize
          (FeatureSetDefaults *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  uint uVar2;
  int cached_size;
  Edition EVar3;
  RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *this_00;
  const_reference this_01;
  uint32_t *puVar4;
  uint8_t *puVar5;
  UnknownFieldSet *unknown_fields;
  FeatureSetDefaults_FeatureSetEditionDefault *repfield;
  uint local_30;
  uint n;
  uint i;
  uint32_t cached_has_bits;
  FeatureSetDefaults *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  FeatureSetDefaults *this_local;
  
  local_30 = 0;
  uVar2 = _internal_defaults_size(this);
  stream_local = (EpsCopyOutputStream *)target;
  for (; local_30 < uVar2; local_30 = local_30 + 1) {
    this_00 = _internal_defaults(this);
    this_01 = RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>::Get
                        (this_00,local_30);
    cached_size = FeatureSetDefaults_FeatureSetEditionDefault::GetCachedSize(this_01);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (1,(MessageLite *)this_01,cached_size,(uint8_t *)stream_local,stream);
  }
  puVar4 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar2 = *puVar4;
  if ((uVar2 & 1) != 0) {
    puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    EVar3 = _internal_minimum_edition(this);
    stream_local = (EpsCopyOutputStream *)internal::WireFormatLite::WriteEnumToArray(4,EVar3,puVar5)
    ;
  }
  if ((uVar2 & 2) != 0) {
    puVar5 = io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    EVar3 = _internal_maximum_edition(this);
    stream_local = (EpsCopyOutputStream *)internal::WireFormatLite::WriteEnumToArray(5,EVar3,puVar5)
    ;
  }
  bVar1 = internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar1) {
    unknown_fields =
         internal::InternalMetadata::unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL FeatureSetDefaults::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const FeatureSetDefaults& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FeatureSetDefaults)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated .google.protobuf.FeatureSetDefaults.FeatureSetEditionDefault defaults = 1;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_defaults_size());
       i < n; i++) {
    const auto& repfield = this_._internal_defaults().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            1, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional .google.protobuf.Edition minimum_edition = 4;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        4, this_._internal_minimum_edition(), target);
  }

  // optional .google.protobuf.Edition maximum_edition = 5;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        5, this_._internal_maximum_edition(), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FeatureSetDefaults)
  return target;
}